

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_complete_chunk
               (png_structrp png_ptr,png_uint_32 chunk_name,png_const_bytep data,size_t length)

{
  size_t length_local;
  png_const_bytep data_local;
  png_uint_32 chunk_name_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if (0x7fffffff < length) {
      png_error(png_ptr,"length exceeds PNG maximum");
    }
    png_write_chunk_header(png_ptr,chunk_name,(png_uint_32)length);
    png_write_chunk_data(png_ptr,data,length);
    png_write_chunk_end(png_ptr);
  }
  return;
}

Assistant:

static void
png_write_complete_chunk(png_structrp png_ptr, png_uint_32 chunk_name,
    png_const_bytep data, size_t length)
{
   if (png_ptr == NULL)
      return;

   /* On 64-bit architectures 'length' may not fit in a png_uint_32. */
   if (length > PNG_UINT_31_MAX)
      png_error(png_ptr, "length exceeds PNG maximum");

   png_write_chunk_header(png_ptr, chunk_name, (png_uint_32)length);
   png_write_chunk_data(png_ptr, data, length);
   png_write_chunk_end(png_ptr);
}